

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Ialltoallv(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Datatype sendtype,
                     void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Datatype recvtype,
                     MPIABI_Comm comm,MPIABI_Request *request)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  ompi_datatype_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_communicator_t *poVar6;
  ompi_request_t **ppoVar7;
  WPI_HandlePtr<ompi_request_t_*> local_68;
  WPI_Handle local_60 [8];
  WPI_Handle local_58 [8];
  WPI_Handle local_50 [8];
  int *local_48;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Datatype sendtype_local;
  int *sdispls_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  local_48 = recvcounts;
  recvcounts_local = (int *)recvbuf;
  recvbuf_local = (void *)sendtype;
  sendtype_local = (MPIABI_Datatype)sdispls;
  sdispls_local = sendcounts;
  sendcounts_local = (int *)sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_50,sendtype);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_50);
  piVar2 = recvcounts_local;
  piVar1 = local_48;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_58,recvtype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_58);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_60,comm);
  poVar6 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_60);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_68,request);
  ppoVar7 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_68);
  iVar3 = MPI_Ialltoallv(sendbuf,sendcounts,sdispls,poVar4,piVar2,piVar1,rdispls,poVar5,poVar6,
                         ppoVar7);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_68);
  return iVar3;
}

Assistant:

int MPIABI_Ialltoallv(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ialltoallv(
    sendbuf,
    sendcounts,
    sdispls,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    rdispls,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}